

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nacm.c
# Opt level: O0

int nacm_position(void *parent,LYEXT_PAR parent_type,LYEXT_SUBSTMT UNUSED_substmt_type)

{
  LYEXT_SUBSTMT UNUSED_substmt_type_local;
  LYEXT_PAR parent_type_local;
  void *parent_local;
  
  if (parent_type == LYEXT_PAR_NODE) {
    if ((*(uint *)((long)parent + 0x38) & 0xf1ff) == 0) {
      parent_local._4_4_ = 1;
    }
    else {
      parent_local._4_4_ = 0;
    }
  }
  else {
    parent_local._4_4_ = 1;
  }
  return parent_local._4_4_;
}

Assistant:

int nacm_position(const void *parent, LYEXT_PAR parent_type, LYEXT_SUBSTMT UNUSED(substmt_type))
{
    if (parent_type != LYEXT_PAR_NODE) {
        return 1;
    }

    if (((struct lys_node*)parent)->nodetype &
            (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE | LYS_ANYDATA | LYS_AUGMENT | LYS_CASE |
             LYS_USES | LYS_RPC | LYS_ACTION | LYS_NOTIF )) {
        return 0;
    } else {
        return 1;
    }
}